

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O2

int ffrsim(fitsfile *fptr,int bitpix,int naxis,long *naxes,int *status)

{
  ulong uVar1;
  LONGLONG tnaxes [99];
  LONGLONG local_328 [100];
  
  if (0 < *status) {
    return *status;
  }
  for (uVar1 = 0; ((long)uVar1 < (long)naxis && (uVar1 < 99)); uVar1 = uVar1 + 1) {
    local_328[uVar1] = naxes[uVar1];
  }
  ffrsimll(fptr,bitpix,naxis,local_328,status);
  return *status;
}

Assistant:

int ffrsim(fitsfile *fptr,      /* I - FITS file pointer           */
           int bitpix,          /* I - bits per pixel              */
           int naxis,           /* I - number of axes in the array */
           long *naxes,         /* I - size of each axis           */
           int *status)         /* IO - error status               */
/*
   resize an existing primary array or IMAGE extension.
*/
{
    LONGLONG tnaxes[99];
    int ii;
    
    if (*status > 0)
        return(*status);

    for (ii = 0; (ii < naxis) && (ii < 99); ii++)
        tnaxes[ii] = naxes[ii];

    ffrsimll(fptr, bitpix, naxis, tnaxes, status);

    return(*status);
}